

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnAtomicFence(SharedValidator *this,Location *loc,uint32_t consistency_model)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = CheckInstr(this,(Opcode)0x1dc,loc);
  if (consistency_model != 0) {
    RVar2 = PrintError(this,loc,"unexpected atomic.fence consistency model (expected 0): %u",
                       (ulong)consistency_model);
    RVar1.enum_ = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  RVar2 = TypeChecker::OnAtomicFence(&this->typechecker_,consistency_model);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicFence(const Location& loc,
                                      uint32_t consistency_model) {
  Result result = CheckInstr(Opcode::AtomicFence, loc);
  if (consistency_model != 0) {
    result |= PrintError(
        loc, "unexpected atomic.fence consistency model (expected 0): %u",
        consistency_model);
  }
  result |= typechecker_.OnAtomicFence(consistency_model);
  return result;
}